

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O0

char * mk_string_dup(char *s)

{
  size_t __n;
  char *p;
  size_t len;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    __n = strlen(s);
    s_local = (char *)mk_mem_alloc(__n + 1);
    if (s_local == (char *)0x0) {
      s_local = (char *)0x0;
    }
    else {
      memcpy(s_local,s,__n);
      s_local[__n] = '\0';
    }
  }
  return s_local;
}

Assistant:

char *mk_string_dup(const char *s)
{
    size_t len;
    char *p;

    if (!s) {
        return NULL;
    }

    len = strlen(s);
    p = mk_mem_alloc(len + 1);
    if (!p) {
        return NULL;
    }
    memcpy(p, s, len);
    p[len] = '\0';

    return p;
}